

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planner.cpp
# Opt level: O2

int __thiscall despot::Planner::RunPlanning(Planner *this,int argc,char **argv)

{
  string world_type_00;
  string solver_type_00;
  Logger *pLVar1;
  clock_t main_clock_start;
  int iVar2;
  Option *options;
  clock_t cVar3;
  undefined4 extraout_var;
  World *pWVar4;
  undefined4 extraout_var_01;
  Belief *belief;
  Solver *solver_00;
  undefined4 extraout_var_03;
  char *__assertion;
  uint __line;
  undefined8 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  bool search_solver;
  Logger *logger;
  undefined4 uStack_140;
  int num_runs;
  World *local_138;
  undefined4 uStack_130;
  int time_limit;
  Solver *solver;
  clock_t local_120;
  ulong local_118;
  string solver_type;
  string belief_type;
  string world_type;
  string local_b0 [32];
  string local_90 [32];
  string local_70;
  string local_50 [32];
  DSPOMDP *model;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  (*(this->super_PlannerBase)._vptr_PlannerBase[5])(&solver_type,this);
  num_runs = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&world_type,"pomdp",(allocator<char> *)&belief_type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&belief_type,"DEFAULT",(allocator<char> *)&solver);
  time_limit = -1;
  options = PlannerBase::InitializeParamers
                      (&this->super_PlannerBase,argc,argv,&solver_type,&search_solver,&num_runs,
                       &world_type,&belief_type,&time_limit);
  if (options == (Option *)0x0) {
LAB_001556bd:
    std::__cxx11::string::~string((string *)&belief_type);
    std::__cxx11::string::~string((string *)&world_type);
    std::__cxx11::string::~string((string *)&solver_type);
    return 0;
  }
  cVar3 = clock();
  iVar2 = (*(this->super_PlannerBase)._vptr_PlannerBase[2])(this,options);
  model = (DSPOMDP *)CONCAT44(extraout_var,iVar2);
  if (model == (DSPOMDP *)0x0) {
    __assertion = "model != NULL";
    __line = 0x57;
  }
  else {
    iVar2 = (*(this->super_PlannerBase)._vptr_PlannerBase[3])(this,&world_type,model,options);
    pWVar4 = (World *)CONCAT44(extraout_var_00,iVar2);
    if (pWVar4 == (World *)0x0) {
      __assertion = "world != NULL";
      __line = 0x5d;
    }
    else {
      local_138 = pWVar4;
      iVar2 = (*pWVar4->_vptr_World[4])(pWVar4);
      std::__cxx11::string::string(local_50,(string *)&belief_type);
      iVar2 = (*model->_vptr_DSPOMDP[9])(model,CONCAT44(extraout_var_01,iVar2),local_50);
      belief = (Belief *)CONCAT44(extraout_var_02,iVar2);
      std::__cxx11::string::~string(local_50);
      if (belief != (Belief *)0x0) {
        std::__cxx11::string::string((string *)&local_70,(string *)&solver_type);
        solver_00 = PlannerBase::InitializeSolver
                              (&this->super_PlannerBase,model,belief,&local_70,options);
        std::__cxx11::string::~string((string *)&local_70);
        logger = (Logger *)0x0;
        local_118 = (ulong)(uint)num_runs;
        solver = solver_00;
        std::__cxx11::string::string(local_90,(string *)&world_type);
        iVar2 = time_limit;
        local_120 = cVar3;
        std::__cxx11::string::string(local_b0,(string *)&solver_type);
        main_clock_start = local_120;
        world_type_00._M_string_length._0_4_ = iVar2;
        world_type_00._M_dataplus._M_p = (pointer)local_90;
        world_type_00._M_string_length._4_4_ = 0;
        world_type_00.field_2._M_allocated_capacity = (size_type)local_b0;
        world_type_00.field_2._8_8_ = in_stack_fffffffffffffea8;
        solver_type_00._M_string_length._0_4_ = uStack_140;
        solver_type_00._M_dataplus._M_p = (pointer)logger;
        solver_type_00._M_string_length._4_4_ = num_runs;
        solver_type_00.field_2._M_allocated_capacity = (size_type)local_138;
        solver_type_00.field_2._8_4_ = uStack_130;
        solver_type_00.field_2._12_4_ = time_limit;
        PlannerBase::InitializeLogger
                  (&this->super_PlannerBase,&logger,options,model,belief,solver_00,(int)local_118,
                   local_120,local_138,world_type_00,in_stack_fffffffffffffeb0,solver_type_00);
        std::__cxx11::string::~string(local_b0);
        std::__cxx11::string::~string(local_90);
        PlannerBase::DisplayParameters(&this->super_PlannerBase,options,model);
        pLVar1 = logger;
        iVar2 = (*local_138->_vptr_World[4])();
        (*pLVar1->_vptr_Logger[2])(pLVar1,CONCAT44(extraout_var_03,iVar2));
        this->step_ = 0;
        this->round_ = 0;
        (*(this->super_PlannerBase)._vptr_PlannerBase[8])(this,&solver,local_138,logger);
        (*logger->_vptr_Logger[3])();
        PlannerBase::PrintResult(&this->super_PlannerBase,1,logger,main_clock_start);
        goto LAB_001556bd;
      }
      __assertion = "belief != NULL";
      __line = 99;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/planner.cpp"
                ,__line,"virtual int despot::Planner::RunPlanning(int, char **)");
}

Assistant:

int Planner::RunPlanning(int argc, char *argv[]) {

	/* =========================
	 * initialize parameters
	 * =========================*/
	string solver_type = ChooseSolver(); //"DESPOT";
	bool search_solver;
	int num_runs = 1;
	string world_type = "pomdp";
	string belief_type = "DEFAULT";
	int time_limit = -1;

	option::Option *options = InitializeParamers(argc, argv, solver_type,
			search_solver, num_runs, world_type, belief_type, time_limit);
	if(options==NULL)
		return 0;
	clock_t main_clock_start = clock();

	/* =========================
	 * initialize model
	 * =========================*/
	DSPOMDP *model = InitializeModel(options);
	assert(model != NULL);

	/* =========================
	 * initialize world
	 * =========================*/
	World *world = InitializeWorld(world_type, model, options);
	assert(world != NULL);

	/* =========================
	 * initialize belief
	 * =========================*/
	Belief* belief = model->InitialBelief(world->GetCurrentState(), belief_type);
	assert(belief != NULL);

	/* =========================
	 * initialize solver
	 * =========================*/
	Solver *solver = InitializeSolver(model, belief, solver_type, options);

	/* =========================
	 * initialize logger
	 * =========================*/
	Logger *logger = NULL;
	InitializeLogger(logger, options, model, belief, solver, num_runs,
			main_clock_start, world, world_type, time_limit, solver_type);
	//world->world_seed(world_seed);

	/* =========================
	 * Display parameters
	 * =========================*/
	DisplayParameters(options, model);

	/* =========================
	 * run planning
	 * =========================*/
	logger->InitRound(world->GetCurrentState());
	round_=0; step_=0;
	PlanningLoop(solver, world, logger);
	logger->EndRound();

	PrintResult(1, logger, main_clock_start);

	return 0;
}